

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_init(nk_context *ctx,nk_allocator *alloc,nk_user_font *font)

{
  nk_user_font *font_local;
  nk_allocator *alloc_local;
  nk_context *ctx_local;
  
  if (alloc == (nk_allocator *)0x0) {
    __assert_fail("alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x43c9,
                  "int nk_init(struct nk_context *, struct nk_allocator *, const struct nk_user_font *)"
                 );
  }
  if (alloc != (nk_allocator *)0x0) {
    nk_setup(ctx,font);
    nk_buffer_init(&ctx->memory,alloc,0x1000);
    nk_pool_init(&ctx->pool,alloc,0x10);
    ctx->use_pool = 1;
  }
  ctx_local._4_4_ = (uint)(alloc != (nk_allocator *)0x0);
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_init(struct nk_context *ctx, struct nk_allocator *alloc,
    const struct nk_user_font *font)
{
    NK_ASSERT(alloc);
    if (!alloc) return 0;
    nk_setup(ctx, font);
    nk_buffer_init(&ctx->memory, alloc, NK_DEFAULT_COMMAND_BUFFER_SIZE);
    nk_pool_init(&ctx->pool, alloc, NK_POOL_DEFAULT_CAPACITY);
    ctx->use_pool = nk_true;
    return 1;
}